

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

GLFWmonitor ** glfwGetMonitors(int *count)

{
  _GLFWmonitor **pp_Var1;
  
  if (count != (int *)0x0) {
    *count = 0;
    if (_glfw.initialized == 0) {
      pp_Var1 = (_GLFWmonitor **)0x0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      *count = _glfw.monitorCount;
      pp_Var1 = _glfw.monitors;
    }
    return (GLFWmonitor **)pp_Var1;
  }
  __assert_fail("count != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/alifarazz[P]bezier_curve/build_O3/_deps/glfw-src/src/monitor.c"
                ,0x12e,"GLFWmonitor **glfwGetMonitors(int *)");
}

Assistant:

GLFWAPI GLFWmonitor** glfwGetMonitors(int* count)
{
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    *count = _glfw.monitorCount;
    return (GLFWmonitor**) _glfw.monitors;
}